

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

bool Js::JavascriptLibrary::InitializeWebAssemblyTablePrototype
               (DynamicObject *prototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  ScriptContext *this_00;
  undefined8 in_RAX;
  uint uVar4;
  JavascriptString *pJVar1;
  JavascriptMethod p_Var2;
  JavascriptFunction *pJVar3;
  ulong uVar5;
  
  uVar4 = (uint)((ulong)in_RAX >> 0x20);
  DeferredTypeHandlerBase::Convert(typeHandler,prototype,mode,6,0);
  this = (((prototype->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  this_00 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  uVar5 = (ulong)uVar4 << 0x20;
  (*(prototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])
            (prototype,0x67,(this->webAssemblyTableConstructor).ptr,6,0,0,uVar5);
  if (((this_00->config).threadConfig)->m_ES6ToStringTag == true) {
    pJVar1 = CreateStringFromCppLiteral<18ul>(this,(char16 (*) [18])0xfff0ca);
    (*(prototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(prototype,0x1b,pJVar1,2,0,0,uVar5 & 0xffffffff00000000);
  }
  p_Var2 = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)WebAssemblyTable::EntryInfo::Grow);
  pJVar3 = AddFunctionToLibraryObject
                     (this,prototype,0xe4,(FunctionInfo *)WebAssemblyTable::EntryInfo::Grow,1,'\x06'
                     );
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var2,pJVar3);
  p_Var2 = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)WebAssemblyTable::EntryInfo::Get);
  pJVar3 = AddFunctionToLibraryObject
                     (this,prototype,0x198,(FunctionInfo *)WebAssemblyTable::EntryInfo::Get,1,'\x06'
                     );
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var2,pJVar3);
  p_Var2 = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)WebAssemblyTable::EntryInfo::Set);
  pJVar3 = AddFunctionToLibraryObject
                     (this,prototype,0x19b,(FunctionInfo *)WebAssemblyTable::EntryInfo::Set,2,'\x06'
                     );
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var2,pJVar3);
  AddAccessorsToLibraryObject
            (this,prototype,0xd1,(FunctionInfo *)WebAssemblyTable::EntryInfo::GetterLength,
             (FunctionInfo *)0x0);
  DynamicObject::SetHasNoEnumerableProperties(prototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeWebAssemblyTablePrototype(DynamicObject* prototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(prototype, mode, 6);

        JavascriptLibrary* library = prototype->GetLibrary();
        ScriptContext* scriptContext = prototype->GetScriptContext();

        library->AddMember(prototype, PropertyIds::constructor, library->webAssemblyTableConstructor);
        if (scriptContext->GetConfig()->IsES6ToStringTagEnabled())
        {
            library->AddMember(prototype, PropertyIds::_symbolToStringTag, library->CreateStringFromCppLiteral(_u("WebAssembly.Table")), PropertyConfigurable);
        }
        scriptContext->SetBuiltInLibraryFunction(WebAssemblyTable::EntryInfo::Grow.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(prototype, PropertyIds::grow, &WebAssemblyTable::EntryInfo::Grow, 1));

        scriptContext->SetBuiltInLibraryFunction(WebAssemblyTable::EntryInfo::Get.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(prototype, PropertyIds::get, &WebAssemblyTable::EntryInfo::Get, 1));

        scriptContext->SetBuiltInLibraryFunction(WebAssemblyTable::EntryInfo::Set.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(prototype, PropertyIds::set, &WebAssemblyTable::EntryInfo::Set, 2));

        library->AddAccessorsToLibraryObject(prototype, PropertyIds::length, &WebAssemblyTable::EntryInfo::GetterLength, nullptr);

        prototype->SetHasNoEnumerableProperties(true);

        return true;
    }